

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr c4::yml::normalize_tag(csubstr tag)

{
  ro_substr pattern;
  ro_substr pattern_00;
  bool bVar1;
  YamlTag_e YVar2;
  error_flags eVar3;
  basic_substring<const_char> *in_RSI;
  basic_substring<const_char> *in_RDI;
  csubstr in_stack_00000038;
  YamlTag_e t;
  undefined8 in_stack_ffffffffffffff60;
  YamlTag_e tag_00;
  basic_substring<char_const> local_98 [8];
  size_t in_stack_ffffffffffffff70;
  basic_substring<const_char> *in_stack_ffffffffffffff78;
  basic_substring<const_char> *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  basic_substring<const_char> *local_50;
  basic_substring<const_char> *local_48;
  csubstr local_40;
  char *local_30;
  undefined4 local_28;
  undefined8 local_20;
  basic_substring<const_char> **local_18;
  basic_substring<const_char> *local_10;
  basic_substring<const_char> *local_8;
  
  tag_00 = (YamlTag_e)((ulong)in_stack_ffffffffffffff60 >> 0x30);
  local_50 = in_RDI;
  local_48 = in_RSI;
  YVar2 = to_tag(in_stack_00000038);
  if (YVar2 == TAG_NONE) {
    basic_substring<char_const>::basic_substring<3ul>
              ((basic_substring<char_const> *)&stack0xffffffffffffff88,(char (*) [3])"!<");
    pattern.len = in_stack_ffffffffffffff88;
    pattern.str = (char *)in_stack_ffffffffffffff80;
    bVar1 = basic_substring<const_char>::begins_with(in_stack_ffffffffffffff78,pattern);
    if (bVar1) {
      local_18 = &local_50;
      local_20 = 1;
      if (local_48 == (basic_substring<const_char> *)0x0) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_30 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_28 = 0x1533;
        handle_error(0x345f1b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
      local_50 = local_10;
      local_48 = local_8;
      in_stack_ffffffffffffff78 = local_10;
      in_stack_ffffffffffffff80 = local_8;
    }
    basic_substring<char_const>::basic_substring<3ul>(local_98,(char (*) [3])"<!");
    pattern_00.len = in_stack_ffffffffffffff88;
    pattern_00.str = (char *)in_stack_ffffffffffffff80;
    bVar1 = basic_substring<const_char>::begins_with(in_stack_ffffffffffffff78,pattern_00);
    if (bVar1) {
      local_40.len = (size_t)local_48;
      local_40.str = (char *)local_50;
    }
    else {
      local_40.len = (size_t)local_48;
      local_40.str = (char *)local_50;
    }
  }
  else {
    local_40 = from_tag(tag_00);
  }
  return local_40;
}

Assistant:

csubstr normalize_tag(csubstr tag)
{
    YamlTag_e t = to_tag(tag);
    if(t != TAG_NONE)
        return from_tag(t);
    if(tag.begins_with("!<"))
        tag = tag.sub(1);
    if(tag.begins_with("<!"))
        return tag;
    return tag;
}